

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetFilePrefix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  bool bVar1;
  cmValue cVar2;
  string suffix;
  string base;
  string local_60;
  string local_40;
  
  bVar1 = IsImported(this);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"",(allocator<char> *)&local_40);
    cVar2 = GetFilePrefixInternal(this,config,artifact,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (cVar2.Value == (string *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)cVar2.Value);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_60.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    GetFullNameInternal(this,config,artifact,__return_storage_ptr__,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFilePrefix(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  if (this->IsImported()) {
    cmValue prefix = this->GetFilePrefixInternal(config, artifact);
    return prefix ? *prefix : std::string();
  }

  std::string prefix;
  std::string suffix;
  std::string base;
  this->GetFullNameInternal(config, artifact, prefix, base, suffix);
  return prefix;
}